

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O0

void __thiscall FluidSynthMIDIDevice::~FluidSynthMIDIDevice(FluidSynthMIDIDevice *this)

{
  _func_int_fluid_synth_t_ptr *p_Var1;
  _func_void_fluid_settings_t_ptr *p_Var2;
  FluidSynthMIDIDevice *this_local;
  
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__FluidSynthMIDIDevice_009f0df0;
  (*(this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice[3])();
  if (this->FluidSynth != (fluid_synth_t *)0x0) {
    p_Var1 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&delete_fluid_synth);
    (*p_Var1)(this->FluidSynth);
  }
  if (this->FluidSettings != (fluid_settings_t *)0x0) {
    p_Var2 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&delete_fluid_settings);
    (*p_Var2)(this->FluidSettings);
  }
  UnloadFluidSynth(this);
  SoftSynthMIDIDevice::~SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  return;
}

Assistant:

FluidSynthMIDIDevice::~FluidSynthMIDIDevice()
{
	Close();
	if (FluidSynth != NULL)
	{
		delete_fluid_synth(FluidSynth);
	}
	if (FluidSettings != NULL)
	{
		delete_fluid_settings(FluidSettings);
	}
#ifdef DYN_FLUIDSYNTH
	UnloadFluidSynth();
#endif
}